

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O3

void __thiscall serial::Serial::SerialImpl::~SerialImpl(SerialImpl *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int in_ESI;
  
  this->_vptr_SerialImpl = (_func_int **)&PTR__SerialImpl_00111ca0;
  close(this,in_ESI);
  pthread_mutex_destroy((pthread_mutex_t *)&this->read_mutex);
  pthread_mutex_destroy((pthread_mutex_t *)&this->write_mutex);
  pcVar1 = (this->port_)._M_dataplus._M_p;
  paVar2 = &(this->port_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Serial::SerialImpl::~SerialImpl ()
{
  close();
  pthread_mutex_destroy(&this->read_mutex);
  pthread_mutex_destroy(&this->write_mutex);
}